

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O2

void creatHuffmanCode(HuffmanTree *huffmanTree,HuffmanCode *huffmanCode,int n)

{
  uint uVar1;
  HuffmanTree paVar2;
  HuffmanTree paVar3;
  void *pvVar4;
  void *__ptr;
  ulong uVar5;
  char *__dest;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  size_t __size;
  size_t __size_00;
  
  __size = (size_t)n;
  pvVar4 = malloc(__size * 8 + 8);
  __ptr = malloc(__size);
  *(undefined1 *)((long)__ptr + (__size - 1)) = 0;
  uVar5 = 0;
  if (0 < n) {
    uVar5 = (ulong)(uint)n;
  }
  for (uVar8 = 1; uVar8 != (int)uVar5 + 1; uVar8 = uVar8 + 1) {
    paVar2 = *huffmanTree;
    paVar3 = paVar2 + uVar8;
    __size_00 = 1;
    uVar9 = uVar8 & 0xffffffff;
    iVar6 = n + -2;
    while( true ) {
      uVar1 = paVar3->parent;
      lVar7 = (long)(int)uVar1;
      if (lVar7 == 0) break;
      *(byte *)((long)__ptr + (long)iVar6) = paVar2[lVar7].lchild == (uint)uVar9 ^ 0x31;
      paVar3 = huffmanTree[lVar7];
      __size_00 = __size_00 + 1;
      iVar6 = iVar6 + -1;
      uVar9 = (ulong)uVar1;
    }
    __dest = (char *)malloc(__size_00);
    *(char **)((long)pvVar4 + uVar8 * 8) = __dest;
    strcpy(__dest,(char *)((long)__ptr + (__size - __size_00)));
  }
  free(__ptr);
  for (lVar7 = 0; uVar5 << 3 != lVar7; lVar7 = lVar7 + 8) {
    printf("Huffmancode of %3d is %s\n",
           (ulong)*(uint *)((long)&(*huffmanTree)[1].weight + lVar7 * 2),
           *(undefined8 *)((long)pvVar4 + lVar7 + 8));
  }
  putchar(10);
  return;
}

Assistant:

void creatHuffmanCode(HuffmanTree *huffmanTree,HuffmanCode *huffmanCode,int n){
    //指示标记
    int i;
    //编码的起始指针
    int start;
    //编码的起始的父节点
    int p;
    //遍历n个叶子结点的指示标记c
    unsigned int c;
    //分配n个编码的头指针
    huffmanCode = (HuffmanCode *)malloc((n + 1) * sizeof(char *));
    //分配求当前编码的工作空间
    char *cd = (char *)malloc(n * sizeof(char));
    //从右向左逐位存放编码，首先存放编码结束符
    cd[n - 1] = '\0';
    //求n个叶子结点对应的哈夫曼编码
    for (i = 1;i <= n;i++){
        //初始化编码起始指针
        start = n - 1;
        //从叶子到根结点求编码
        for (c = i,p =  (*huffmanTree)[i].parent;p != 0; c = p, p = (*huffmanTree[p]).parent) {
            if ((*huffmanTree)[p].lchild == c) {
                //从右到左的顺序编码入数组内
                cd[--start] = '0';  //左分支标0
            } else {
                cd[--start] = '1';  //右分支标1
            }

        }//为第i个编码分配空间
            huffmanCode[i] = (char *)malloc((n - start) * sizeof(char));

            strcpy(huffmanCode[i],&cd[start]);
    }

        free(cd);
        //打印编码序列
        for(i = 1;i <= n;i++){
            printf("Huffmancode of %3d is %s\n",(*huffmanTree)[i].weight,huffmanCode[i]);
        }

    printf("\n");
}